

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

void __thiscall booster::locale::impl_icu::num_parse<char>::~num_parse(num_parse<char> *this)

{
  *(undefined ***)this = &PTR__num_parse_001db3f8;
  std::__cxx11::string::~string((string *)&this->enc_);
  icu_70::Locale::~Locale(&this->loc_);
  std::locale::facet::~facet((facet *)this);
  return;
}

Assistant:

num_parse(cdata const &d,size_t refs = 0) : 
        std::num_get<CharType>(refs),
        loc_(d.locale),
        enc_(d.encoding)
    {
    }